

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clear_under.cpp
# Opt level: O1

Element __thiscall ftxui::clear_under(ftxui *this,Element *child)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Element EVar1;
  undefined1 local_29;
  ClearUnder *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  local_28 = (ClearUnder *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<ftxui::ClearUnder,std::allocator<ftxui::ClearUnder>,std::shared_ptr<ftxui::Node>>
            (&local_20,&local_28,(allocator<ftxui::ClearUnder> *)&local_29,child);
  *(ClearUnder **)this = local_28;
  *(undefined8 *)(this + 8) = 0;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = local_20._M_pi;
  EVar1.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar1.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Element)EVar1.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Element clear_under(Element child) {
  return std::make_shared<ClearUnder>(std::move(child));
}